

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumDotsTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumDotsTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TextureMapping2DHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&>
            (__return_storage_ptr__,
             "[ SpectrumDotsTexture mapping: %s insideDot: %s outsideDot: %s ]",&this->mapping,
             &this->insideDot,&this->outsideDot);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumDotsTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumDotsTexture mapping: %s insideDot: %s outsideDot: %s ]", mapping,
        insideDot, outsideDot);
}